

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O0

void __thiscall CArmInstruction::Encode(CArmInstruction *this)

{
  uint local_38;
  uint local_34;
  uint local_24;
  uint local_20;
  int immediate_1;
  int immediate;
  int shiftAmount;
  uchar shiftType;
  uint encoding;
  CArmInstruction *this_local;
  
  if (((this->Vars).Opcode.UseNewEncoding & 1U) == 0) {
    local_34 = (this->Opcode).encoding;
  }
  else {
    local_34 = (this->Vars).Opcode.NewEncoding;
  }
  shiftAmount = local_34;
  if (((this->Opcode).flags & 0x200U) == 0) {
    shiftAmount = (uint)(this->Vars).Opcode.c << 0x1c | local_34;
  }
  if (((this->Vars).Opcode.s & 1U) != 0) {
    shiftAmount = shiftAmount | 0x100000;
  }
  if (((this->Vars).Shift.UseFinal & 1U) == 0) {
    immediate._3_1_ = (this->Vars).Shift.Type;
    immediate_1 = (this->Vars).Shift.ShiftAmount;
  }
  else {
    immediate._3_1_ = (this->Vars).Shift.FinalType;
    immediate_1 = (this->Vars).Shift.FinalShiftAmount;
  }
  if (((this->Vars).Opcode.UseNewType & 1U) == 0) {
    local_38 = (uint)((this->Opcode).field_0x14 & 0xf);
  }
  else {
    local_38 = (uint)(this->Vars).Opcode.NewType;
  }
  switch(local_38) {
  case 0:
    shiftAmount = (this->Vars).rn.num | shiftAmount;
    break;
  case 1:
    if ((((this->Opcode).flags & 0x80U) != 0) && (((this->Vars).Immediate & 2U) != 0)) {
      shiftAmount = shiftAmount | 0x1000000;
    }
    shiftAmount = (this->Vars).Immediate >> 2 & 0xffffffU | shiftAmount;
    break;
  case 2:
    if (((this->Opcode).flags & 8U) != 0) {
      shiftAmount = (this->Vars).rn.num << 0x10 | shiftAmount;
    }
    if (((this->Opcode).flags & 4U) != 0) {
      shiftAmount = (this->Vars).rd.num << 0xc | shiftAmount;
    }
    if (((this->Opcode).flags & 0x20U) == 0) {
      if (((this->Opcode).flags & 0x400U) != 0) {
        if (((this->Vars).Shift.UseShift & 1U) != 0) {
          if (((this->Vars).Shift.ShiftByRegister & 1U) == 0) {
            shiftAmount = immediate_1 << 7 | shiftAmount;
          }
          else {
            shiftAmount = (this->Vars).Shift.reg.num << 8 | shiftAmount | 0x10;
          }
          shiftAmount = (uint)immediate._3_1_ << 5 | shiftAmount;
        }
        shiftAmount = (this->Vars).rm.num | shiftAmount;
      }
    }
    else {
      shiftAmount = (this->Vars).Immediate | immediate_1 << 7 | shiftAmount;
    }
    break;
  case 3:
    if (((this->Opcode).flags & 0x100000U) == 0) {
      if (((this->Vars).PsrData.spsr & 1U) != 0) {
        shiftAmount = shiftAmount | 0x400000;
      }
      shiftAmount = (this->Vars).PsrData.field << 0x10 | shiftAmount;
      if (((this->Opcode).flags & 0x400U) == 0) {
        if (((this->Opcode).flags & 0x20U) != 0) {
          shiftAmount = (this->Vars).Immediate | immediate_1 << 7 | shiftAmount;
        }
      }
      else {
        shiftAmount = (this->Vars).rm.num | shiftAmount;
      }
    }
    else {
      if (((this->Vars).PsrData.spsr & 1U) != 0) {
        shiftAmount = shiftAmount | 0x400000;
      }
      shiftAmount = (this->Vars).rd.num << 0xc | shiftAmount;
    }
    break;
  case 4:
    shiftAmount = (this->Vars).rd.num << 0x10 | shiftAmount;
    if (((this->Opcode).flags & 8U) != 0) {
      shiftAmount = (this->Vars).rn.num << 0xc | shiftAmount;
    }
    shiftAmount = (this->Vars).rs.num << 8 | shiftAmount;
    if ((((this->Opcode).flags & 0x4000U) != 0) && (((this->Vars).Opcode.y & 1U) != 0)) {
      shiftAmount = shiftAmount | 0x40;
    }
    if ((((this->Opcode).flags & 0x2000U) != 0) && (((this->Vars).Opcode.x & 1U) != 0)) {
      shiftAmount = shiftAmount | 0x20;
    }
    shiftAmount = (this->Vars).rm.num | shiftAmount;
    break;
  default:
    printf("doh");
    break;
  case 6:
    if (((this->Vars).writeback & 1U) != 0) {
      shiftAmount = shiftAmount | 0x200000;
    }
    if (((this->Opcode).flags & 8U) != 0) {
      shiftAmount = (this->Vars).rn.num << 0x10 | shiftAmount;
    }
    if (((this->Opcode).flags & 4U) != 0) {
      shiftAmount = (this->Vars).rd.num << 0xc | shiftAmount;
    }
    if ((((this->Opcode).flags & 0x4000000U) != 0) && (((this->Vars).SignPlus & 1U) == 0)) {
      shiftAmount = shiftAmount & 0xff7fffff;
    }
    if ((((this->Opcode).flags & 0x20000U) != 0) && (((this->Vars).negative & 1U) != 0)) {
      shiftAmount = shiftAmount & 0xff7fffff;
    }
    if (((this->Opcode).flags & 0x20U) == 0) {
      if (((this->Opcode).flags & 0x400U) != 0) {
        if (((this->Vars).Shift.UseShift & 1U) != 0) {
          shiftAmount = (uint)immediate._3_1_ << 5 | immediate_1 << 7 | shiftAmount;
        }
        shiftAmount = (this->Vars).rm.num | shiftAmount;
      }
    }
    else {
      local_20 = (this->Vars).Immediate;
      if ((int)local_20 < 0) {
        shiftAmount = shiftAmount & 0xff7fffff;
        if ((int)local_20 < 1) {
          local_20 = -local_20;
        }
      }
      shiftAmount = local_20 | shiftAmount;
    }
    break;
  case 7:
    if (((this->Vars).writeback & 1U) != 0) {
      shiftAmount = shiftAmount | 0x200000;
    }
    shiftAmount = (this->Vars).rd.num << 0xc | (this->Vars).rn.num << 0x10 | shiftAmount;
    if ((((this->Opcode).flags & 0x4000000U) != 0) && (((this->Vars).SignPlus & 1U) == 0)) {
      shiftAmount = shiftAmount & 0xff7fffff;
    }
    if ((((this->Opcode).flags & 0x20000U) != 0) && (((this->Vars).negative & 1U) != 0)) {
      shiftAmount = shiftAmount & 0xff7fffff;
    }
    if (((this->Opcode).flags & 0x20U) == 0) {
      if (((this->Opcode).flags & 0x400U) != 0) {
        shiftAmount = (this->Vars).rm.num | shiftAmount;
      }
    }
    else {
      local_24 = (this->Vars).Immediate;
      if ((int)local_24 < 0) {
        shiftAmount = shiftAmount & 0xff7fffff;
        if ((int)local_24 < 1) {
          local_24 = -local_24;
        }
      }
      shiftAmount = local_24 & 0xf | (local_24 & 0xf0) << 4 | shiftAmount;
    }
    break;
  case 8:
    if (((this->Opcode).flags & 0x800U) == 0) {
      if (((this->Opcode).flags & 0x1000U) != 0) {
        shiftAmount = (uint)"\x03\x01\x02"[(this->Vars).Opcode.a] << 0x17 | shiftAmount;
      }
    }
    else {
      shiftAmount = (uint)"\x03\x01\x02"[(this->Vars).Opcode.a] << 0x17 | shiftAmount;
    }
    if (((this->Vars).psr & 1U) != 0) {
      shiftAmount = shiftAmount | 0x400000;
    }
    if (((this->Vars).writeback & 1U) != 0) {
      shiftAmount = shiftAmount | 0x200000;
    }
    if (((this->Opcode).flags & 8U) != 0) {
      shiftAmount = (this->Vars).rn.num << 0x10 | shiftAmount;
    }
    shiftAmount = (this->Vars).rlist | shiftAmount;
    break;
  case 9:
  case 0xf:
    shiftAmount = (this->Vars).rd.num << 0xc | (this->Vars).rm.num | shiftAmount;
    if (((this->Opcode).flags & 8U) != 0) {
      shiftAmount = (this->Vars).rn.num << 0x10 | shiftAmount;
    }
    break;
  case 10:
    if (((this->Opcode).flags & 0x200000U) == 0) {
      shiftAmount = ((this->Vars).Immediate >> 4) << 8 | (this->Vars).Immediate & 0xfU | shiftAmount
      ;
    }
    else {
      shiftAmount = (this->Vars).Immediate | shiftAmount;
    }
    break;
  case 0xb:
    if (((this->Opcode).flags & 0x400000U) != 0) {
      shiftAmount = (this->Vars).CopData.Cpop << 0x14 | shiftAmount;
    }
    shiftAmount = (this->Vars).CopData.pn.num << 8 |
                  (this->Vars).CopData.cd.num << 0xc |
                  (this->Vars).CopData.cn.num << 0x10 | shiftAmount;
    if (((this->Opcode).flags & 0x800000U) != 0) {
      shiftAmount = (this->Vars).CopData.Cpinf << 5 | shiftAmount;
    }
    shiftAmount = (this->Vars).CopData.cm.num | shiftAmount;
    break;
  case 0xd:
    if (((this->Opcode).flags & 0x400000U) != 0) {
      shiftAmount = (this->Vars).CopData.Cpop << 0x15 | shiftAmount;
    }
    shiftAmount = (this->Vars).CopData.pn.num << 8 |
                  (this->Vars).rd.num << 0xc | (this->Vars).CopData.cn.num << 0x10 | shiftAmount;
    if (((this->Opcode).flags & 0x800000U) != 0) {
      shiftAmount = (this->Vars).CopData.Cpinf << 5 | shiftAmount;
    }
    shiftAmount = (this->Vars).CopData.cm.num | shiftAmount;
    break;
  case 0xe:
    shiftAmount = (this->Vars).CopData.cm.num |
                  (this->Vars).CopData.Cpop << 4 |
                  (this->Vars).CopData.pn.num << 8 |
                  (this->Vars).rd.num << 0xc | (this->Vars).rn.num << 0x10 | shiftAmount;
  }
  FileManager::writeU32(g_fileManager,shiftAmount);
  return;
}

Assistant:

void CArmInstruction::Encode() const
{
	unsigned int encoding = Vars.Opcode.UseNewEncoding ? Vars.Opcode.NewEncoding : Opcode.encoding;

	if ((Opcode.flags & ARM_UNCOND) == 0) encoding |= Vars.Opcode.c << 28;
	if (Vars.Opcode.s) encoding |= (1 << 20);

	unsigned char shiftType;
	int shiftAmount;
	if (Vars.Shift.UseFinal)
	{
		shiftType = Vars.Shift.FinalType;
		shiftAmount = Vars.Shift.FinalShiftAmount;
	} else {
		shiftType = Vars.Shift.Type;
		shiftAmount = Vars.Shift.ShiftAmount;
	}

	switch (Vars.Opcode.UseNewType ? Vars.Opcode.NewType : Opcode.type)
	{
	case ARM_TYPE3:		// ARM.3: Branch and Exchange (BX, BLX)
		encoding |= (Vars.rn.num << 0);
		break;
	case ARM_TYPE4:		// ARM.4: Branch and Branch with Link (B, BL, BLX)
		if ((Opcode.flags & ARM_HALFWORD) && (Vars.Immediate & 2)) encoding |= 1 << 24;
		encoding |= (Vars.Immediate >> 2) & 0xFFFFFF;
		break;
	case ARM_TYPE5:		// ARM.5: Data Processing
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		if (Opcode.flags & ARM_D) encoding |= (Vars.rd.num << 12);

		if (Opcode.flags & ARM_IMMEDIATE)	// immediate als op2
		{
			encoding |= (shiftAmount << 7);
			encoding |= Vars.Immediate;
		} else if (Opcode.flags & ARM_REGISTER) {	// shifted register als op2
			if (Vars.Shift.UseShift)
			{
				if (Vars.Shift.ShiftByRegister)
				{
					encoding |= (Vars.Shift.reg.num << 8);
					encoding |= (1 << 4);
				} else {	// shiftbyimmediate
					encoding |= (shiftAmount << 7);
				}
				encoding |= (shiftType << 5);
			}
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE6:		// ARM.6: PSR Transfer (MRS, MSR)
		if (Opcode.flags & ARM_MRS) //  MRS{cond} Rd,Psr          ;Rd = Psr
		{
			if (Vars.PsrData.spsr) encoding |= (1 << 22);
			encoding |= (Vars.rd.num << 12);
		} else {					//  MSR{cond} Psr{_field},Op  ;Psr[field] = Op
			if (Vars.PsrData.spsr) encoding |= (1 << 22);
			encoding |= (Vars.PsrData.field << 16);

			if (Opcode.flags & ARM_REGISTER)
			{
				encoding |= (Vars.rm.num << 0);
			} else if (Opcode.flags & ARM_IMMEDIATE)
			{
				encoding |= (shiftAmount << 7);
				encoding |= Vars.Immediate;
			}
		}
		break;
	case ARM_TYPE7:		// ARM.7: Multiply and Multiply-Accumulate (MUL,MLA)
		encoding |= (Vars.rd.num << 16);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 12);
		encoding |= (Vars.rs.num << 8);
		if ((Opcode.flags & ARM_Y) && Vars.Opcode.y) encoding |= (1 << 6);
		if ((Opcode.flags & ARM_X) && Vars.Opcode.x) encoding |= (1 << 5);
		encoding |= (Vars.rm.num << 0);
		break;
	case ARM_TYPE9:		// ARM.9: Single Data Transfer (LDR, STR, PLD)
		if (Vars.writeback) encoding |= (1 << 21);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		if (Opcode.flags & ARM_D) encoding |= (Vars.rd.num << 12);
		if ((Opcode.flags & ARM_SIGN) && !Vars.SignPlus) encoding &= ~(1 << 23);
		if ((Opcode.flags & ARM_ABS) && Vars.negative) encoding &= ~(1 << 23);
		if (Opcode.flags & ARM_IMMEDIATE)
		{
			int immediate = Vars.Immediate;
			if (immediate < 0)
			{
				encoding &= ~(1 << 23);
				immediate = abs(immediate);
			}
			encoding |= (immediate << 0);
		} else if (Opcode.flags & ARM_REGISTER)	// ... means the opcocde uses shifts with immediates
		{
			if (Vars.Shift.UseShift)
			{
				encoding |= (shiftAmount << 7);
				encoding |= (shiftType << 5);
			}
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE10:	// ARM.10: Halfword, Doubleword, and Signed Data Transfer
		if (Vars.writeback) encoding |= (1 << 21);
		encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rd.num << 12);
		if ((Opcode.flags & ARM_SIGN) && !Vars.SignPlus) encoding &= ~(1 << 23);
		if ((Opcode.flags & ARM_ABS) && Vars.negative) encoding &= ~(1 << 23);
		if (Opcode.flags & ARM_IMMEDIATE)
		{
			int immediate = Vars.Immediate;
			if (immediate < 0)
			{
				encoding &= ~(1 << 23);
				immediate = abs(immediate);
			}
			encoding |= ((immediate & 0xF0) << 4);
			encoding |= (immediate & 0xF);
		} else if (Opcode.flags & ARM_REGISTER)
		{
			encoding |= (Vars.rm.num << 0);
		}
		break;
	case ARM_TYPE11:	// ARM.11: Block Data Transfer (LDM,STM)
		if (Opcode.flags & ARM_LOAD) encoding |= (LdmModes[Vars.Opcode.a] << 23);
		else if (Opcode.flags & ARM_STORE) encoding |= (StmModes[Vars.Opcode.a] << 23);
		if (Vars.psr) encoding |= (1 << 22);
		if (Vars.writeback) encoding |= (1 << 21);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rlist);
		break;
	case ARM_TYPE12:	// ARM.12: Single Data Swap (SWP)
	case ARM_MISC:		// ARM.X: Count Leading Zeros
		encoding |= (Vars.rm.num << 0);
		encoding |= (Vars.rd.num << 12);
		if (Opcode.flags & ARM_N) encoding |= (Vars.rn.num << 16);
		break;
	case ARM_TYPE13:	// ARM.13: Software Interrupt (SWI,BKPT)
		if (Opcode.flags & ARM_SWI)
		{
			encoding |= Vars.Immediate;
		} else {
			encoding |= (Vars.Immediate & 0xF);
			encoding |= (Vars.Immediate >> 4) << 8;
		}
		break;
	case ARM_TYPE14:	// ARM.14: Coprocessor Data Operations (CDP)
		if (Opcode.flags & ARM_COPOP) encoding |= (Vars.CopData.Cpop << 20);
		encoding |= (Vars.CopData.cn.num << 16);
		encoding |= (Vars.CopData.cd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		if (Opcode.flags & ARM_COPINF) encoding |= (Vars.CopData.Cpinf << 5);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	case ARM_TYPE16:	// ARM.16: Coprocessor Register Transfers (MRC, MCR)
		if (Opcode.flags & ARM_COPOP) encoding |= (Vars.CopData.Cpop << 21);
		encoding |= (Vars.CopData.cn.num << 16);
		encoding |= (Vars.rd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		if (Opcode.flags & ARM_COPINF) encoding |= (Vars.CopData.Cpinf << 5);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	case ARM_TYPE17:	// ARM.X: Coprocessor Double-Register Transfer (MCRR,MRRC)
		encoding |= (Vars.rn.num << 16);
		encoding |= (Vars.rd.num << 12);
		encoding |= (Vars.CopData.pn.num << 8);
		encoding |= (Vars.CopData.Cpop << 4);
		encoding |= (Vars.CopData.cm.num << 0);
		break;
	default:
		printf("doh");
	}

	g_fileManager->writeU32((uint32_t)encoding);
}